

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O2

void __thiscall
cmCursesCacheEntryComposite::cmCursesCacheEntryComposite
          (cmCursesCacheEntryComposite *this,string *key,cmState *state,bool isNew,int labelwidth,
          int entrywidth)

{
  int *__args_1;
  _Head_base<0UL,_cmCursesLabelWidget_*,_false> _Var1;
  cmCursesLabelWidget *pcVar2;
  cmCursesWidget *pcVar3;
  _Head_base<0UL,_cmCursesWidget_*,_false> _Var4;
  bool value;
  CacheEntryType CVar5;
  cmValue value_00;
  cmValue cVar6;
  char *extraout_RDX;
  string *opt;
  undefined8 uVar7;
  int iVar8;
  string_view value_01;
  string_view arg;
  undefined1 local_80 [8];
  _Head_base<0UL,_cmCursesWidget_*,_false> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  unique_ptr<cmCursesWidget,_std::default_delete<cmCursesWidget>_> *local_50;
  unique_ptr<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_> *local_48;
  int local_3c;
  string *local_38;
  
  local_48 = &this->IsNewLabel;
  local_50 = &this->Entry;
  local_38 = &this->Key;
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->IsNewLabel)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)0x0;
  (this->Entry)._M_t.super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
  _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)0x0;
  std::__cxx11::string::string((string *)local_38,(string *)key);
  this->LabelWidth = labelwidth;
  this->EntryWidth = entrywidth;
  iVar8 = 1;
  local_78._M_head_impl._0_4_ = 1;
  local_80._0_4_ = iVar8;
  local_80._4_4_ = iVar8;
  std::make_unique<cmCursesLabelWidget,int&,int,int,int,std::__cxx11::string_const&>
            ((int *)local_70[0]._M_local_buf,&this->LabelWidth,(int *)&local_78,
             (int *)(local_80 + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  uVar7 = local_70[0]._M_allocated_capacity;
  local_70[0]._M_allocated_capacity = (cmCursesLabelWidget *)0x0;
  _Var1._M_head_impl =
       (this->Label)._M_t.
       super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
       super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
       super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (this->Label)._M_t.
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)uVar7;
  if ((_Var1._M_head_impl != (cmCursesLabelWidget *)0x0) &&
     ((**(code **)(*(long *)&(_Var1._M_head_impl)->super_cmCursesWidget + 8))(),
     (cmCursesLabelWidget *)local_70[0]._0_8_ != (cmCursesLabelWidget *)0x0)) {
    (**(code **)(*(long *)local_70[0]._0_8_ + 8))();
  }
  local_3c = iVar8;
  if (isNew) {
    local_78._M_head_impl._0_4_ = 1;
    local_80._0_4_ = iVar8;
    local_80._4_4_ = iVar8;
    std::make_unique<cmCursesLabelWidget,int,int,int,int,char_const(&)[2]>
              ((int *)local_70[0]._M_local_buf,(int *)&local_78,(int *)(local_80 + 4),
               (int *)local_80,(char (*) [2])&local_3c);
  }
  else {
    local_78._M_head_impl._0_4_ = 1;
    local_80._0_4_ = iVar8;
    local_80._4_4_ = iVar8;
    std::make_unique<cmCursesLabelWidget,int,int,int,int,char_const(&)[2]>
              ((int *)local_70[0]._M_local_buf,(int *)&local_78,(int *)(local_80 + 4),
               (int *)local_80,(char (*) [2])&local_3c);
  }
  uVar7 = local_70[0]._M_allocated_capacity;
  local_70[0]._M_allocated_capacity = (cmCursesStringWidget *)0x0;
  pcVar2 = (local_48->_M_t).
           super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
           super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl;
  (local_48->_M_t).
  super___uniq_ptr_impl<cmCursesLabelWidget,_std::default_delete<cmCursesLabelWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesLabelWidget_*,_std::default_delete<cmCursesLabelWidget>_>.
  super__Head_base<0UL,_cmCursesLabelWidget_*,_false>._M_head_impl = (cmCursesLabelWidget *)uVar7;
  if ((pcVar2 != (cmCursesLabelWidget *)0x0) &&
     ((**(code **)((long)(pcVar2->super_cmCursesWidget)._vptr_cmCursesWidget + 8))(),
     (cmCursesStringWidget *)local_70[0]._0_8_ != (cmCursesStringWidget *)0x0)) {
    (**(code **)(*(long *)local_70[0]._0_8_ + 8))();
  }
  value_00 = cmState::GetCacheEntryValue(state,key);
  if (value_00.Value == (string *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/cmCursesCacheEntryComposite.cxx"
                  ,0x35,
                  "cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(const std::string &, cmState *, bool, int, int)"
                 );
  }
  CVar5 = cmState::GetCacheEntryType(state,key);
  if (UNINITIALIZED < CVar5) {
    return;
  }
  __args_1 = &this->EntryWidth;
  switch(CVar5) {
  case BOOL:
    local_78._M_head_impl._0_4_ = 1;
    local_80._0_4_ = iVar8;
    local_80._4_4_ = iVar8;
    std::make_unique<cmCursesBoolWidget,int&,int,int,int>
              ((int *)local_70[0]._M_local_buf,__args_1,(int *)&local_78,(int *)(local_80 + 4));
    uVar7 = local_70[0]._M_allocated_capacity;
    value_01._M_str = extraout_RDX;
    value_01._M_len = (size_t)((value_00.Value)->_M_dataplus)._M_p;
    value = cmValue::IsOn((cmValue *)(value_00.Value)->_M_string_length,value_01);
    cmCursesBoolWidget::SetValueAsBool((cmCursesBoolWidget *)uVar7,value);
    break;
  case PATH:
    local_78._M_head_impl._0_4_ = 1;
    local_80._0_4_ = iVar8;
    local_80._4_4_ = iVar8;
    std::make_unique<cmCursesPathWidget,int&,int,int,int>
              ((int *)local_70[0]._M_local_buf,__args_1,(int *)&local_78,(int *)(local_80 + 4));
    cmCursesStringWidget::SetString((cmCursesStringWidget *)local_70[0]._0_8_,value_00.Value);
    break;
  case FILEPATH:
    local_78._M_head_impl._0_4_ = 1;
    local_80._0_4_ = iVar8;
    local_80._4_4_ = iVar8;
    std::make_unique<cmCursesFilePathWidget,int&,int,int,int>
              ((int *)local_70[0]._M_local_buf,__args_1,(int *)&local_78,(int *)(local_80 + 4));
    cmCursesStringWidget::SetString((cmCursesStringWidget *)local_70[0]._0_8_,value_00.Value);
    break;
  case STRING:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70[0]._M_local_buf,"STRINGS",(allocator<char> *)&local_78);
    cVar6 = cmState::GetCacheEntryProperty(state,key,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
    if (cVar6.Value == (string *)0x0) {
      local_78._M_head_impl._0_4_ = 1;
      local_80._0_4_ = iVar8;
      local_80._4_4_ = iVar8;
      std::make_unique<cmCursesStringWidget,int&,int,int,int>
                ((int *)local_70[0]._M_local_buf,__args_1,(int *)&local_78,(int *)(local_80 + 4));
      cmCursesStringWidget::SetString((cmCursesStringWidget *)local_70[0]._0_8_,value_00.Value);
      break;
    }
    local_70[0]._0_4_ = 1;
    local_80._0_4_ = iVar8;
    local_80._4_4_ = iVar8;
    std::make_unique<cmCursesOptionsWidget,int&,int,int,int>
              ((int *)&local_78,__args_1,(int *)local_70[0]._M_local_buf,(int *)(local_80 + 4));
    arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar6.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70,arg,false);
    for (uVar7 = local_70[0]._M_allocated_capacity; uVar7 != local_70[0]._8_8_;
        uVar7 = ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)&((cmCursesWidget *)uVar7)->Value)->_M_local_buf + 0x10) {
      cmCursesOptionsWidget::AddOption
                ((cmCursesOptionsWidget *)local_78._M_head_impl,(string *)uVar7);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_70);
    cmCursesOptionsWidget::SetOption((cmCursesOptionsWidget *)local_78._M_head_impl,value_00.Value);
    _Var4._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (cmCursesWidget *)0x0;
    pcVar3 = (local_50->_M_t).
             super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
             super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
             super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl;
    (local_50->_M_t).super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>.
    _M_t.super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
    super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (pcVar3 == (cmCursesWidget *)0x0) {
      return;
    }
    (*pcVar3->_vptr_cmCursesWidget[1])();
    uVar7 = local_78._M_head_impl;
    goto LAB_0014ac80;
  default:
    goto switchD_0014aa6d_caseD_4;
  case UNINITIALIZED:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   "Found an undefined variable: ",key);
    cmSystemTools::Error((string *)local_70);
    std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
    goto switchD_0014aa6d_caseD_4;
  }
  uVar7 = local_70[0]._M_allocated_capacity;
  local_70[0]._M_allocated_capacity = (cmCursesWidget *)0x0;
  pcVar3 = (local_50->_M_t).
           super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
           super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
           super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl;
  (local_50->_M_t).super___uniq_ptr_impl<cmCursesWidget,_std::default_delete<cmCursesWidget>_>._M_t.
  super__Tuple_impl<0UL,_cmCursesWidget_*,_std::default_delete<cmCursesWidget>_>.
  super__Head_base<0UL,_cmCursesWidget_*,_false>._M_head_impl = (cmCursesWidget *)uVar7;
  if (pcVar3 != (cmCursesWidget *)0x0) {
    (*pcVar3->_vptr_cmCursesWidget[1])();
    uVar7 = local_70[0]._M_allocated_capacity;
LAB_0014ac80:
    if ((cmCursesWidget *)uVar7 != (cmCursesWidget *)0x0) {
      (**(code **)(((_Alloc_hider *)&((cmCursesWidget *)uVar7)->_vptr_cmCursesWidget)->_M_p + 8))();
    }
  }
switchD_0014aa6d_caseD_4:
  return;
}

Assistant:

cmCursesCacheEntryComposite::cmCursesCacheEntryComposite(
  const std::string& key, cmState* state, bool isNew, int labelwidth,
  int entrywidth)
  : Key(key)
  , LabelWidth(labelwidth)
  , EntryWidth(entrywidth)
{
  this->Label =
    cm::make_unique<cmCursesLabelWidget>(this->LabelWidth, 1, 1, 1, key);
  if (isNew) {
    this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, "*");
  } else {
    this->IsNewLabel = cm::make_unique<cmCursesLabelWidget>(1, 1, 1, 1, " ");
  }

  cmValue value = state->GetCacheEntryValue(key);
  assert(value);
  switch (state->GetCacheEntryType(key)) {
    case cmStateEnums::BOOL: {
      auto bw = cm::make_unique<cmCursesBoolWidget>(this->EntryWidth, 1, 1, 1);
      bw->SetValueAsBool(cmIsOn(*value));
      this->Entry = std::move(bw);
      break;
    }
    case cmStateEnums::PATH: {
      auto pw = cm::make_unique<cmCursesPathWidget>(this->EntryWidth, 1, 1, 1);
      pw->SetString(*value);
      this->Entry = std::move(pw);
      break;
    }
    case cmStateEnums::FILEPATH: {
      auto fpw =
        cm::make_unique<cmCursesFilePathWidget>(this->EntryWidth, 1, 1, 1);
      fpw->SetString(*value);
      this->Entry = std::move(fpw);
      break;
    }
    case cmStateEnums::STRING: {
      cmValue stringsProp = state->GetCacheEntryProperty(key, "STRINGS");
      if (stringsProp) {
        auto ow =
          cm::make_unique<cmCursesOptionsWidget>(this->EntryWidth, 1, 1, 1);
        for (std::string const& opt : cmExpandedList(*stringsProp)) {
          ow->AddOption(opt);
        }
        ow->SetOption(*value);
        this->Entry = std::move(ow);
      } else {
        auto sw =
          cm::make_unique<cmCursesStringWidget>(this->EntryWidth, 1, 1, 1);
        sw->SetString(*value);
        this->Entry = std::move(sw);
      }
      break;
    }
    case cmStateEnums::UNINITIALIZED:
      cmSystemTools::Error("Found an undefined variable: " + key);
      break;
    default:
      // TODO : put warning message here
      break;
  }
}